

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

int __thiscall QAccessibleTable::columnCount(QAccessibleTable *this)

{
  int iVar1;
  int iVar2;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar3;
  long in_FS_OFFSET;
  QModelIndex local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAbstractItemView *)view(this);
  pQVar3 = QAbstractItemView::model(this_00);
  if (pQVar3 == (QAbstractItemModel *)0x0) {
    iVar2 = 0;
  }
  else {
    QAbstractItemView::rootIndex(&local_40,this_00);
    iVar1 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&local_40);
    iVar2 = 1;
    if (iVar1 < 1) {
      iVar2 = iVar1;
    }
    if (this->m_role != List) {
      iVar2 = iVar1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int QAccessibleTable::columnCount() const
{
    const QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return 0;
    const int modelColumnCount = theModel->columnCount(theView->rootIndex());
    return m_role == QAccessible::List ? qMin(1, modelColumnCount) : modelColumnCount;
}